

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::CompileRegexp(int iters,string *regexp)

{
  Prog *pPVar1;
  ostream *poVar2;
  LogMessage local_350;
  Prog *local_1d0;
  Prog *prog;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  string *psStack_18;
  int i;
  string *regexp_local;
  int iters_local;
  
  psStack_18 = regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_38,psStack_18);
    local_28 = Regexp::Parse(&local_38,LikePerl,(RegexpStatus *)0x0);
    if (local_28 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x2ae);
      poVar2 = LogMessage::stream(&local_1b8);
      std::operator<<(poVar2,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    }
    local_1d0 = Regexp::CompileToProg(local_28,0);
    if (local_1d0 == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_350,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x2b0);
      poVar2 = LogMessage::stream(&local_350);
      std::operator<<(poVar2,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_350);
    }
    pPVar1 = local_1d0;
    if (local_1d0 != (Prog *)0x0) {
      Prog::~Prog(local_1d0);
      operator_delete(pPVar1);
    }
    Regexp::Decref(local_28);
  }
  return;
}

Assistant:

void CompileRegexp(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    delete prog;
    re->Decref();
  }
}